

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac_oggbs__goto_next_page
                    (ma_dr_flac_oggbs *oggbs,ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)

{
  ma_uint32 i_1;
  ma_result mVar1;
  ma_bool32 mVar2;
  size_t sVar3;
  ma_uint64 mVar4;
  int i;
  ulong uVar5;
  ma_uint32 mVar6;
  ma_uint32 pageBodySize;
  uint uVar7;
  ma_uint64 offset;
  ma_uint32 crc32;
  ma_dr_flac_ogg_crc_mismatch_recovery local_160;
  ma_uint32 bytesRead;
  ma_uint8 *local_158;
  ma_dr_flac_ogg_page_header header;
  
  local_158 = oggbs->pageData;
  local_160 = recoveryMethod;
  while( true ) {
    while( true ) {
      do {
        crc32 = 0;
        mVar1 = ma_dr_flac_ogg__read_page_header
                          (oggbs->onRead,oggbs->pUserData,&header,&bytesRead,&crc32);
        if (mVar1 != MA_SUCCESS) {
          return 0;
        }
        oggbs->currentBytePos = oggbs->currentBytePos + (ulong)bytesRead;
        offset = 0;
        for (uVar5 = 0; uVar7 = (uint)offset, header.segmentCount != uVar5; uVar5 = uVar5 + 1) {
          offset = (ma_uint64)(uVar7 + header.segmentTable[uVar5]);
        }
      } while (0xff1b < uVar7);
      if (header.serialNumber == oggbs->serialNumber) break;
      if ((uVar7 != 0) &&
         (mVar2 = ma_dr_flac_oggbs__seek_physical(oggbs,offset,ma_dr_flac_seek_origin_current),
         mVar2 == 0)) {
        return 0;
      }
    }
    sVar3 = (*oggbs->onRead)(oggbs->pUserData,local_158,offset);
    oggbs->currentBytePos = oggbs->currentBytePos + sVar3;
    if (sVar3 != offset) {
      return 0;
    }
    oggbs->pageDataSize = uVar7;
    mVar6 = crc32;
    for (mVar4 = 0; offset != mVar4; mVar4 = mVar4 + 1) {
      mVar6 = mVar6 << 8 ^ ma_dr_flac__crc32_table[mVar6 >> 0x18 ^ (uint)oggbs->pageData[mVar4]];
    }
    if (mVar6 == header.checksum) break;
    if (local_160 != ma_dr_flac_ogg_recover_on_crc_mismatch) {
      ma_dr_flac_oggbs__goto_next_page(oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
      return 0;
    }
  }
  memcpy(&oggbs->currentPageHeader,&header,0x120);
  oggbs->bytesRemainingInPage = uVar7;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__goto_next_page(ma_dr_flac_oggbs* oggbs, ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)
{
    ma_dr_flac_ogg_page_header header;
    for (;;) {
        ma_uint32 crc32 = 0;
        ma_uint32 bytesRead;
        ma_uint32 pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        ma_uint32 actualCRC32;
#endif
        if (ma_dr_flac_ogg__read_page_header(oggbs->onRead, oggbs->pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += bytesRead;
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize > MA_DR_FLAC_OGG_MAX_PAGE_SIZE) {
            continue;
        }
        if (header.serialNumber != oggbs->serialNumber) {
            if (pageBodySize > 0 && !ma_dr_flac_oggbs__seek_physical(oggbs, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            continue;
        }
        if (ma_dr_flac_oggbs__read_physical(oggbs, oggbs->pageData, pageBodySize) != pageBodySize) {
            return MA_FALSE;
        }
        oggbs->pageDataSize = pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        actualCRC32 = ma_dr_flac_crc32_buffer(crc32, oggbs->pageData, oggbs->pageDataSize);
        if (actualCRC32 != header.checksum) {
            if (recoveryMethod == ma_dr_flac_ogg_recover_on_crc_mismatch) {
                continue;
            } else {
                ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_recover_on_crc_mismatch);
                return MA_FALSE;
            }
        }
#else
        (void)recoveryMethod;
#endif
        oggbs->currentPageHeader = header;
        oggbs->bytesRemainingInPage = pageBodySize;
        return MA_TRUE;
    }
}